

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ProtoFrameworkCollector::ConsumeLine
          (ProtoFrameworkCollector *this,StringPiece *line,string *out_error)

{
  bool bVar1;
  stringpiece_ssize_type sVar2;
  long lVar3;
  pointer ppVar4;
  ostream *poVar5;
  string *in_RDX;
  long in_RDI;
  iterator existing_entry;
  StringPiece proto_file;
  int start;
  StringPiece proto_file_list;
  StringPiece framework_name;
  int offset;
  mapped_type *in_stack_fffffffffffffd98;
  StringPiece *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  StringPiece *in_stack_fffffffffffffdb0;
  StringPiece *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  ostream *in_stack_fffffffffffffde0;
  string local_1c8 [32];
  string local_1a8 [32];
  StringPiece local_188 [2];
  string local_168 [32];
  string local_148 [32];
  _Self local_128;
  string local_120 [32];
  _Self local_100;
  StringPiece local_f8;
  int local_e4;
  StringPiece local_e0;
  StringPiece local_d0;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  string local_68 [32];
  string local_48 [36];
  int local_24;
  string *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  sVar2 = StringPiece::find(in_stack_fffffffffffffdb8,
                            (char)((ulong)in_stack_fffffffffffffdb0 >> 0x38),
                            (size_type)in_stack_fffffffffffffda8);
  local_24 = (int)sVar2;
  if (local_24 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,"Framework/proto file mapping line without colon sign: \'",&local_89);
    StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffd98);
    std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
    std::__cxx11::string::operator=(local_20,local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    local_1 = false;
  }
  else {
    local_d0 = StringPiece::substr(in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8,
                                   (size_type)in_stack_fffffffffffffda0);
    local_e0 = StringPiece::substr(in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8,
                                   (size_type)in_stack_fffffffffffffda0);
    TrimWhitespace(in_stack_fffffffffffffda0);
    local_e4 = 0;
    while (lVar3 = (long)local_e4, sVar2 = StringPiece::length(&local_e0), lVar3 < sVar2) {
      sVar2 = StringPiece::find(in_stack_fffffffffffffdb8,
                                (char)((ulong)in_stack_fffffffffffffdb0 >> 0x38),
                                (size_type)in_stack_fffffffffffffda8);
      local_24 = (int)sVar2;
      if (local_24 == -1) {
        sVar2 = StringPiece::length(&local_e0);
        local_24 = (int)sVar2;
      }
      local_f8 = StringPiece::substr(in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8,
                                     (size_type)in_stack_fffffffffffffda0);
      TrimWhitespace(in_stack_fffffffffffffda0);
      sVar2 = StringPiece::size(&local_f8);
      if (sVar2 != 0) {
        StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffd98);
        local_100._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffd98,(key_type *)0x49f780);
        std::__cxx11::string::~string(local_120);
        local_128._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffd98);
        bVar1 = std::operator!=(&local_100,&local_128);
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "warning: duplicate proto file reference, replacing framework entry for \'"
                                  );
          StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffd98);
          poVar5 = std::operator<<(poVar5,local_148);
          poVar5 = std::operator<<(poVar5,"\' with \'");
          StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffd98);
          in_stack_fffffffffffffde0 = std::operator<<(poVar5,local_168);
          in_stack_fffffffffffffdd8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::operator<<(in_stack_fffffffffffffde0,"\' (was \'");
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)0x49f893);
          poVar5 = std::operator<<((ostream *)in_stack_fffffffffffffdd8,(string *)&ppVar4->second);
          poVar5 = std::operator<<(poVar5,"\').");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_168);
          std::__cxx11::string::~string(local_148);
          std::ostream::flush();
        }
        sVar2 = StringPiece::find(in_stack_fffffffffffffdb8,
                                  (char)((ulong)in_stack_fffffffffffffdb0 >> 0x38),
                                  (size_type)in_stack_fffffffffffffda8);
        if (sVar2 != -1) {
          in_stack_fffffffffffffdb0 =
               (StringPiece *)
               std::operator<<((ostream *)&std::cerr,
                               "note: framework mapping file had a proto file with a space in, hopefully that isn\'t a missing comma: \'"
                              );
          in_stack_fffffffffffffdb8 = local_188;
          StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffd98);
          poVar5 = std::operator<<((ostream *)in_stack_fffffffffffffdb0,
                                   (string *)in_stack_fffffffffffffdb8);
          in_stack_fffffffffffffda8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::operator<<(poVar5,"\'");
          std::ostream::operator<<(in_stack_fffffffffffffda8,std::endl<char,std::char_traits<char>>)
          ;
          std::__cxx11::string::~string((string *)local_188);
          std::ostream::flush();
        }
        StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffd98);
        in_stack_fffffffffffffda0 = *(StringPiece **)(in_RDI + 8);
        StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffd98);
        in_stack_fffffffffffffd98 =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        std::__cxx11::string::operator=((string *)in_stack_fffffffffffffd98,local_1a8);
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::string::~string(local_1a8);
      }
      local_e4 = local_24 + 1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImportWriter::ProtoFrameworkCollector::ConsumeLine(
    const StringPiece& line, string* out_error) {
  int offset = line.find(':');
  if (offset == StringPiece::npos) {
    *out_error =
        string("Framework/proto file mapping line without colon sign: '") +
        string(line) + "'.";
    return false;
  }
  StringPiece framework_name = line.substr(0, offset);
  StringPiece proto_file_list = line.substr(offset + 1);
  TrimWhitespace(&framework_name);

  int start = 0;
  while (start < proto_file_list.length()) {
    offset = proto_file_list.find(',', start);
    if (offset == StringPiece::npos) {
      offset = proto_file_list.length();
    }

    StringPiece proto_file = proto_file_list.substr(start, offset - start);
    TrimWhitespace(&proto_file);
    if (proto_file.size() != 0) {
      std::map<string, string>::iterator existing_entry =
          map_->find(string(proto_file));
      if (existing_entry != map_->end()) {
        std::cerr << "warning: duplicate proto file reference, replacing "
                     "framework entry for '"
                  << string(proto_file) << "' with '" << string(framework_name)
                  << "' (was '" << existing_entry->second << "')." << std::endl;
        std::cerr.flush();
      }

      if (proto_file.find(' ') != StringPiece::npos) {
        std::cerr << "note: framework mapping file had a proto file with a "
                     "space in, hopefully that isn't a missing comma: '"
                  << string(proto_file) << "'" << std::endl;
        std::cerr.flush();
      }

      (*map_)[string(proto_file)] = string(framework_name);
    }

    start = offset + 1;
  }

  return true;
}